

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

double cos_power_int(double a,double b,int n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double __x;
  double __x_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double __y;
  
  if (n < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"COS_POWER_INT - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Power N < 0.\n");
    exit(1);
  }
  dVar2 = sin(a);
  dVar3 = sin(b);
  __x = cos(a);
  __x_00 = cos(b);
  uVar1 = (n & 1U) + 2;
  if ((n & 1U) == 0) {
    dVar6 = b - a;
  }
  else {
    dVar6 = dVar3 - dVar2;
  }
  if (uVar1 <= (uint)n) {
    do {
      __y = (double)(int)(uVar1 - 1);
      dVar4 = pow(__x,__y);
      dVar5 = pow(__x_00,__y);
      dVar6 = (dVar5 * dVar3 + (dVar6 * __y - dVar4 * dVar2)) / (double)(int)uVar1;
      uVar1 = uVar1 + 2;
    } while ((int)uVar1 <= n);
  }
  return dVar6;
}

Assistant:

double cos_power_int ( double a, double b, int n )

//****************************************************************************80
//
//  Purpose:
//
//    COS_POWER_INT evaluates the cosine power integral.
//
//  Discussion:
//
//    The function is defined by
//
//      COS_POWER_INT(A,B,N) = Integral ( A <= T <= B ) ( cos ( t ))^n dt
//
//    The algorithm uses the following fact:
//
//      Integral cos^n ( t ) = -(1/n) * (
//        cos^(n-1)(t) * sin(t) + ( n-1 ) * Integral cos^(n-2) ( t ) dt )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    31 March 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters
//
//    Input, double A, B, the limits of integration.
//
//    Input, integer N, the power of the sine function.
//
//    Output, double COS_POWER_INT, the value of the integral.
//
{
  double ca;
  double cb;
  int m;
  int mlo;
  double sa;
  double sb;
  double value;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "COS_POWER_INT - Fatal error!\n";
    std::cerr << "  Power N < 0.\n";
    exit ( 1 );
  }

  sa = sin ( a );
  sb = sin ( b );
  ca = cos ( a );
  cb = cos ( b );

  if ( ( n % 2 ) == 0 )
  {
    value = b - a;
    mlo = 2;
  }
  else
  {
    value = sb - sa;
    mlo = 3;
  }

  for ( m = mlo; m <= n; m = m + 2 )
  {
    value = ( double( m - 1 ) * value 
      - pow ( ca, (m-1) ) * sa + pow ( cb, (m-1) ) * sb ) 
      / double( m );
  }

  return value;
}